

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_mstring_get_wcs(archive *a,archive_mstring *aes,wchar_t **wp)

{
  wchar_t wVar1;
  
  wVar1 = aes->aes_set;
  if ((wVar1 & 4U) == 0) {
    *wp = (wchar_t *)0x0;
    if ((wVar1 & 1U) == 0) {
      return L'\0';
    }
    (aes->aes_wcs).length = 0;
    wVar1 = archive_wstring_append_from_mbs(&aes->aes_wcs,(aes->aes_mbs).s,(aes->aes_mbs).length);
    if (wVar1 != L'\0') {
      return L'\xffffffff';
    }
    *(byte *)&aes->aes_set = (byte)aes->aes_set | 4;
  }
  *wp = (aes->aes_wcs).s;
  return L'\0';
}

Assistant:

int
archive_mstring_get_wcs(struct archive *a, struct archive_mstring *aes,
    const wchar_t **wp)
{
	int r, ret = 0;

	(void)a;/* UNUSED */
	/* Return WCS form if we already have it. */
	if (aes->aes_set & AES_SET_WCS) {
		*wp = aes->aes_wcs.s;
		return (ret);
	}

	*wp = NULL;
	/* Try converting MBS to WCS using native locale. */
	if (aes->aes_set & AES_SET_MBS) {
		archive_wstring_empty(&(aes->aes_wcs));
		r = archive_wstring_append_from_mbs(&(aes->aes_wcs),
		    aes->aes_mbs.s, aes->aes_mbs.length);
		if (r == 0) {
			aes->aes_set |= AES_SET_WCS;
			*wp = aes->aes_wcs.s;
		} else
			ret = -1;/* failure. */
	}
	return (ret);
}